

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_unroller.cpp
# Opt level: O2

void __thiscall
spvtools::opt::anon_unknown_0::LoopUnrollerUtilsImpl::LinkLastPhisToStart
          (LoopUnrollerUtilsImpl *this,Loop *loop)

{
  Instruction *pIVar1;
  uint32_t index;
  uint32_t uVar2;
  uint32_t uVar3;
  size_t i;
  ulong uVar4;
  initializer_list<unsigned_int> init_list;
  initializer_list<unsigned_int> init_list_00;
  uint32_t local_84;
  LoopUnrollerUtilsImpl *local_80;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> inductions;
  SmallVector<unsigned_int,_2UL> local_58;
  
  inductions.
  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  inductions.
  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  inductions.
  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_80 = this;
  Loop::GetInductionVariables(loop,&inductions);
  for (uVar4 = 0;
      uVar4 < (ulong)((long)inductions.
                            super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)inductions.
                            super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3); uVar4 = uVar4 + 1) {
    pIVar1 = (local_80->state_).previous_phis_.
             super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar4];
    index = GetPhiIndexFromLabel((local_80->state_).previous_latch_block_,pIVar1);
    uVar2 = Instruction::GetSingleWordInOperand(pIVar1,index - 1);
    uVar3 = Instruction::GetSingleWordInOperand(pIVar1,index);
    pIVar1 = inductions.
             super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar4];
    init_list._M_len = 1;
    init_list._M_array = &local_84;
    local_84 = uVar2;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_58,init_list);
    Instruction::SetInOperand(pIVar1,index - 1,&local_58);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_58);
    init_list_00._M_len = 1;
    init_list_00._M_array = &local_84;
    local_84 = uVar3;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_58,init_list_00);
    Instruction::SetInOperand(pIVar1,index,&local_58);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_58);
  }
  std::_Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
  ~_Vector_base(&inductions.
                 super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
               );
  return;
}

Assistant:

void LoopUnrollerUtilsImpl::LinkLastPhisToStart(Loop* loop) const {
  std::vector<Instruction*> inductions;
  loop->GetInductionVariables(inductions);

  for (size_t i = 0; i < inductions.size(); ++i) {
    Instruction* last_phi_in_block = state_.previous_phis_[i];

    uint32_t phi_index =
        GetPhiIndexFromLabel(state_.previous_latch_block_, last_phi_in_block);
    uint32_t phi_variable =
        last_phi_in_block->GetSingleWordInOperand(phi_index - 1);
    uint32_t phi_label = last_phi_in_block->GetSingleWordInOperand(phi_index);

    Instruction* phi = inductions[i];
    phi->SetInOperand(phi_index - 1, {phi_variable});
    phi->SetInOperand(phi_index, {phi_label});
  }
}